

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.hpp
# Opt level: O0

void __thiscall
ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::
cursor<false>::cursor(cursor<false> *this,cursor<false> *param_1)

{
  cursor<false> *param_1_local;
  cursor<false> *this_local;
  
  this->rng_ = param_1->rng_;
  variant<int_*,_int_*>::variant(&this->its_,&param_1->its_);
  return;
}

Assistant:

struct cursor
        {
            using difference_type = common_type_t<range_difference_t<Rngs>...>;

        private:
            friend struct cursor<!IsConst>;
            template<typename T>
            using constify_if = meta::const_if_c<IsConst, T>;
            using concat_view_t = constify_if<concat_view>;
            concat_view_t * rng_;
            variant<iterator_t<constify_if<Rngs>>...> its_;

            template<std::size_t N>
            void satisfy(meta::size_t<N>)
            {
                RANGES_EXPECT(its_.index() == N);
                if(ranges::get<N>(its_) == end(std::get<N>(rng_->rngs_)))
                {
                    ranges::emplace<N + 1>(its_, begin(std::get<N + 1>(rng_->rngs_)));
                    this->satisfy(meta::size_t<N + 1>{});
                }
            }
            void satisfy(meta::size_t<cranges - 1>)
            {
                RANGES_EXPECT(its_.index() == cranges - 1);
            }
            struct next_fun
            {
                cursor * pos;
                template(typename I, std::size_t N)(
                    /// \pre
                    requires input_iterator<I>)
                void operator()(indexed_element<I, N> it) const
                {
                    RANGES_ASSERT(it.get() != end(std::get<N>(pos->rng_->rngs_)));
                    ++it.get();
                    pos->satisfy(meta::size_t<N>{});
                }
            };
            struct prev_fun
            {
                cursor * pos;
                template(typename I)(
                    /// \pre
                    requires bidirectional_iterator<I>)
                void operator()(indexed_element<I, 0> it) const
                {
                    RANGES_ASSERT(it.get() != begin(std::get<0>(pos->rng_->rngs_)));
                    --it.get();
                }